

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O0

RGBColor __thiscall pm::Matte::pathShade(Matte *this,ShadeRecord *sr)

{
  undefined8 uVar1;
  Vector3 *in_RDX;
  RGBColor RVar2;
  undefined1 local_88 [12];
  RGBColor local_7c;
  RGBColor local_70;
  undefined1 local_64 [8];
  Ray reflectedRay;
  float nDotWi;
  RGBColor f;
  float pdf;
  Vector3 wo;
  Vector3 wi;
  ShadeRecord *sr_local;
  Matte *this_local;
  
  Vector3::Vector3((Vector3 *)&wo.y);
  Vector3::operator-((Vector3 *)&f.b);
  f.g = 0.0;
  Lambertian::sampleF((Lambertian *)&reflectedRay.d.z,(ShadeRecord *)&(sr->ray).d,in_RDX,
                      (Vector3 *)&f.b,&wo.y);
  reflectedRay.d.y = dot((Vector3 *)&in_RDX[3].y,(Vector3 *)&wo.y);
  Ray::Ray((Ray *)local_64,(Vector3 *)&in_RDX[1].y,(Vector3 *)&wo.y);
  uVar1._0_4_ = in_RDX[8].x;
  uVar1._4_4_ = in_RDX[8].y;
  (**(code **)(**(long **)&in_RDX[8].z + 0x18))
            (local_88,*(long **)&in_RDX[8].z,uVar1,local_64,(int)in_RDX[6].y + 1);
  RGBColor::operator*(&local_7c,(RGBColor *)&reflectedRay.d.z);
  RGBColor::operator*(&local_70,reflectedRay.d.y);
  RVar2 = RGBColor::operator/((RGBColor *)this,f.g);
  return RVar2;
}

Assistant:

RGBColor Matte::pathShade(ShadeRecord &sr) const
{
	Vector3 wi;
	const Vector3 wo = -sr.ray.d;
	float pdf = 0.0f;
	const RGBColor f = diffuseBrdf_.sampleF(sr, wo, wi, pdf);
	const float nDotWi = dot(sr.normal, wi);
	const Ray reflectedRay(sr.hitPoint, wi);

	return (f * sr.tracer.traceRay(sr.world, reflectedRay, sr.depth + 1) * nDotWi / pdf);
}